

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

int jx9Builtin_sprintf(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  undefined8 in_RAX;
  char *zIn;
  int nLen;
  
  nLen = (int)((ulong)in_RAX >> 0x20);
  if (((0 < nArg) && (((*apArg)->iFlags & 1) != 0)) &&
     (zIn = jx9_value_to_string(*apArg,&nLen), 0 < nLen)) {
    jx9InputFormat(sprintfConsumer,pCtx,zIn,nLen,nArg,apArg,(void *)0x0,0);
    return 0;
  }
  jx9_value_string(pCtx->pRet,"",0);
  return 0;
}

Assistant:

static int jx9Builtin_sprintf(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	const char *zFormat;
	int nLen;
	if( nArg < 1 || !jx9_value_is_string(apArg[0]) ){
		/* Missing/Invalid arguments, return the empty string */
		jx9_result_string(pCtx, "", 0);
		return JX9_OK;
	}
	/* Extract the string format */
	zFormat = jx9_value_to_string(apArg[0], &nLen);
	if( nLen < 1 ){
		/* Empty string */
		jx9_result_string(pCtx, "", 0);
		return JX9_OK;
	}
	/* Format the string */
	jx9InputFormat(sprintfConsumer, pCtx, zFormat, nLen, nArg, apArg, 0, FALSE);
	return JX9_OK;
}